

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

void setup_header(FFSBuffer buf,FMFormat_conflict f,estate s)

{
  int iVar1;
  ssize_t sVar2;
  FFSBuffer in_RDX;
  long in_RSI;
  long *in_RDI;
  int align_pad;
  ssize_t tmp_data;
  int header_size;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = *(int *)(in_RSI + 0x20);
  if (*(int *)(in_RSI + 0x48) != 0) {
    iVar1 = iVar1 + 8;
  }
  iVar1 = (8U - iVar1 & 7) + iVar1;
  sVar2 = add_to_tmp_buffer(in_RDX,CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  memcpy((void *)(*in_RDI + sVar2),*(void **)(in_RSI + 0x28),(long)*(int *)(in_RSI + 0x20));
  memset((void *)(*in_RDI + sVar2 + (long)*(int *)(in_RSI + 0x20)),0,
         (long)(iVar1 - *(int *)(in_RSI + 0x20)));
  *(long *)((long)in_RDX[1].tmp_buffer + 0x10) = (long)iVar1;
  *(ssize_t *)((long)in_RDX[1].tmp_buffer + 8) = sVar2;
  *(undefined8 *)in_RDX[1].tmp_buffer = 0;
  *(int *)((long)&in_RDX->tmp_buffer_in_use_size + 4) =
       *(int *)((long)&in_RDX->tmp_buffer_in_use_size + 4) + 1;
  in_RDX->tmp_buffer_size = (long)iVar1;
  return;
}

Assistant:

void
setup_header(FFSBuffer buf, FMFormat f, estate s) 
{
    int header_size = f->server_ID.length;
    ssize_t tmp_data;	/* offset for header */
    int align_pad;

    if (f->variant) {
	header_size += 8;	/* length info */
    }
    align_pad = (8 - header_size) & 0x7;	/* align to 8 */
    header_size += align_pad;

    tmp_data = add_to_tmp_buffer(buf, header_size);

    memcpy((char *) buf->tmp_buffer + tmp_data, f->server_ID.value,
	   f->server_ID.length);

    memset((char*)buf->tmp_buffer + tmp_data + f->server_ID.length,
	   0, header_size - f->server_ID.length);

    /* fill in an IOV field for the header */
    s->iovec[0].iov_len = header_size;
    s->iovec[0].iov_offset = tmp_data;
    s->iovec[0].iov_base = NULL;	/* offset is in tmp_data */
    s->iovcnt++;
    s->output_len = header_size;
}